

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_mesh_shading.cpp
# Opt level: O2

bool spvtools::val::IsInterfaceVariable(ValidationState_t *_,Instruction *inst,ExecutionModel model)

{
  uint uVar1;
  uint32_t entry_point;
  _Rb_tree<spv::ExecutionModel,_spv::ExecutionModel,_std::_Identity<spv::ExecutionModel>,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *this;
  const_iterator cVar2;
  vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
  *pvVar3;
  EntryPointDescription *desc;
  pointer pEVar4;
  bool bVar5;
  pointer puVar6;
  uint32_t *puVar7;
  ExecutionModel local_3c;
  uint32_t *local_38;
  
  puVar7 = (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_38 = (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  bVar5 = false;
  local_3c = model;
  do {
    if (puVar7 == local_38) {
      return bVar5;
    }
    entry_point = *puVar7;
    this = &ValidationState_t::GetExecutionModels(_,entry_point)->_M_t;
    cVar2 = std::
            _Rb_tree<spv::ExecutionModel,_spv::ExecutionModel,_std::_Identity<spv::ExecutionModel>,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
            ::find(this,&local_3c);
    if ((_Rb_tree_header *)cVar2._M_node == &(this->_M_impl).super__Rb_tree_header) {
      return false;
    }
    pvVar3 = ValidationState_t::entry_point_descriptions(_,entry_point);
    for (pEVar4 = (pvVar3->
                  super__Vector_base<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pEVar4 != (pvVar3->
                  super__Vector_base<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
                  )._M_impl.super__Vector_impl_data._M_finish; pEVar4 = pEVar4 + 1) {
      puVar6 = (pEVar4->interfaces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        if (puVar6 == (pEVar4->interfaces).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish) goto LAB_00564f46;
        uVar1 = *puVar6;
        puVar6 = puVar6 + 1;
      } while ((inst->inst_).result_id != uVar1);
      bVar5 = true;
LAB_00564f46:
    }
    puVar7 = puVar7 + 1;
  } while( true );
}

Assistant:

bool IsInterfaceVariable(ValidationState_t& _, const Instruction* inst,
                         spv::ExecutionModel model) {
  bool foundInterface = false;
  for (auto entry_point : _.entry_points()) {
    const auto* models = _.GetExecutionModels(entry_point);
    if (models->find(model) == models->end()) return false;
    for (const auto& desc : _.entry_point_descriptions(entry_point)) {
      for (auto interface : desc.interfaces) {
        if (inst->id() == interface) {
          foundInterface = true;
          break;
        }
      }
    }
  }
  return foundInterface;
}